

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lipm-dcm-estimator.cpp
# Opt level: O2

void __thiscall
stateObservation::LipmDcmEstimator::setInputs
          (LipmDcmEstimator *this,Vector2 *dcm,Vector2 *zmp,Matrix2 *orientation,
          Vector2 *CoMOffset_gamma,double ZMPCoef_kappa)

{
  LinearKalmanFilter *this_00;
  double dVar1;
  bool bVar2;
  TimeSize TVar3;
  SrcEvaluatorType srcEvaluator;
  Type local_b8;
  Vector2 y;
  Scalar local_70;
  Product<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Transpose<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>,_0>
  local_68;
  Vector4 u;
  
  setUnbiasedCoMOffset(this,CoMOffset_gamma);
  if ((this->kappa_ != ZMPCoef_kappa) || (NAN(this->kappa_) || NAN(ZMPCoef_kappa))) {
    this->kappa_ = ZMPCoef_kappa;
    this->needUpdateMatrices_ = true;
  }
  this_00 = &this->filter_;
  bVar2 = ZeroDelayObserver::stateIsSet((ZeroDelayObserver *)this_00);
  if (bVar2) {
    TVar3 = ZeroDelayObserver::getMeasurementsNumber((ZeroDelayObserver *)this_00);
    if (1 < TVar3) {
      update(this);
    }
    y.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         (dcm->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
         [0];
    y.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         (dcm->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
         [1];
    Eigen::CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>>::
    CommaInitializer<Eigen::Matrix<double,2,1,0,2,1>>
              ((CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>> *)&local_b8,&u,
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&this->previousZmp_);
    Eigen::CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>> *)&local_b8,
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&this->gamma_);
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&local_b8);
    dVar1 = (zmp->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
            array[1];
    (this->previousZmp_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
    m_data.array[0] =
         (zmp->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
         [0];
    (this->previousZmp_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
    m_data.array[1] = dVar1;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_b8,
               (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&y);
    ZeroDelayObserver::pushMeasurement((ZeroDelayObserver *)this_00,(MeasureVector *)&local_b8);
    free(local_b8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false>,_0>.m_data);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_b8,
               (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&u);
    ZeroDelayObserver::pushInput((ZeroDelayObserver *)this_00,(InputVector *)&local_b8);
    free(local_b8.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_2,_2,_false>,_0>.m_data);
    local_68.m_lhs = orientation;
    local_68.m_rhs.m_matrix = &this->previousOrientation_;
    Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::bottomRightCorner<2,2>(&local_b8,&this->A_);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,2,2,false>,Eigen::Product<Eigen::Matrix<double,2,2,0,2,2>,Eigen::Transpose<Eigen::Matrix<double,2,2,0,2,2>>,0>>
              (&local_b8,&local_68);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,2,2,0,2,2>,Eigen::Matrix<double,2,2,0,2,2>>
              (&this->previousOrientation_,orientation);
  }
  else {
    local_70 = 0.0;
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Constant
              ((ConstantReturnType *)&u,&local_70);
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&local_b8,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)&u);
    Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Constant
              ((ConstantReturnType *)&local_68,(Scalar *)&defaultBiasUncertainty);
    Eigen::PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&y,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                *)&local_68);
    resetWithMeasurements(this,dcm,zmp,orientation,true,(Vector2 *)&local_b8,&y);
  }
  return;
}

Assistant:

void LipmDcmEstimator::setInputs(const Vector2 & dcm,
                                 const Vector2 & zmp,
                                 const Matrix2 & orientation,
                                 const Vector2 & CoMOffset_gamma,
                                 const double ZMPCoef_kappa)
{
  setUnbiasedCoMOffset(CoMOffset_gamma);
  setZMPCoef(ZMPCoef_kappa);
  if(filter_.stateIsSet())
  {
    if(filter_.getMeasurementsNumber() > 1)
    {
      update(); /// update the estimation of the state to synchronize with the measurements
    }

    Vector4 u;
    Vector2 y;

    y = dcm;

    /// The prediction of the state depends on the previous value of the ZMP
    u << previousZmp_, gamma_;
    previousZmp_ = zmp;

    filter_.pushMeasurement(y);
    filter_.pushInput(u);

    A_.bottomRightCorner<2, 2>() = orientation * previousOrientation_.transpose(); /// set the rotation difference
    previousOrientation_ = orientation;
  }
  else
  {
    resetWithMeasurements(dcm, zmp, orientation, true);
  }
}